

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btDantzigLCP.cpp
# Opt level: O3

void __thiscall btLCP::pN_plusequals_s_times_qN(btLCP *this,btScalar *p,btScalar s,btScalar *q)

{
  int iVar1;
  long lVar2;
  long lVar3;
  
  iVar1 = this->m_nN;
  if (0 < (long)iVar1) {
    lVar3 = (long)this->m_nC;
    lVar2 = 0;
    do {
      p[lVar3 + lVar2] = q[lVar3 + lVar2] * s + p[lVar3 + lVar2];
      lVar2 = lVar2 + 1;
    } while (iVar1 != lVar2);
  }
  return;
}

Assistant:

void btLCP::pN_plusequals_s_times_qN (btScalar *p, btScalar s, btScalar *q)
{
  const int nC = m_nC;
  btScalar *ptgt = p + nC, *qsrc = q + nC;
  const int nN = m_nN;
  for (int i=0; i<nN; ++i) {
    ptgt[i] += s*qsrc[i];
  }
}